

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DeviceContextVkImpl.cpp
# Opt level: O0

void __thiscall
Diligent::DeviceContextVkImpl::MapBuffer
          (DeviceContextVkImpl *this,IBuffer *pBuffer,MAP_TYPE MapType,MAP_FLAGS MapFlags,
          PVoid *pMappedData)

{
  undefined *puVar1;
  MAP_FLAGS MVar2;
  bool bVar3;
  Int32 IVar4;
  BufferVkImpl *this_00;
  Char *pCVar5;
  undefined8 uVar6;
  void *pvVar7;
  size_type sVar8;
  reference this_01;
  reference pvVar9;
  VkBuffer_T *pVVar10;
  Uint8 *pUVar11;
  char (*Args_2) [115];
  IndexWrapper<unsigned_char,_Diligent::_DeviceContextIndexTag> *in_R9;
  undefined1 local_140 [8];
  string msg_4;
  Uint8 *CPUAddress;
  string msg_3;
  VulkanDynamicAllocation *DynAllocation;
  string msg_2;
  Uint32 DynamicBufferId;
  string msg_1;
  string _msg;
  undefined1 local_58 [8];
  string msg;
  BufferDesc *BuffDesc;
  BufferVkImpl *pBufferVk;
  PVoid *pMappedData_local;
  MAP_FLAGS MapFlags_local;
  MAP_TYPE MapType_local;
  IBuffer *pBuffer_local;
  DeviceContextVkImpl *this_local;
  
  Args_2 = (char (*) [115])pMappedData;
  DeviceContextBase<Diligent::EngineVkImplTraits>::MapBuffer
            ((DeviceContextBase<Diligent::EngineVkImplTraits> *)this,pBuffer,MapType,MapFlags,
             pMappedData);
  this_00 = ClassPtrCast<Diligent::BufferVkImpl,Diligent::IBuffer>(pBuffer);
  msg.field_2._8_8_ =
       DeviceObjectBase<Diligent::IBufferVk,_Diligent::RenderDeviceVkImpl,_Diligent::BufferDesc>::
       GetDesc((DeviceObjectBase<Diligent::IBufferVk,_Diligent::RenderDeviceVkImpl,_Diligent::BufferDesc>
                *)this_00);
  if (MapType == MAP_READ) {
    if ((((BufferDesc *)msg.field_2._8_8_)->Usage != USAGE_STAGING) &&
       (((BufferDesc *)msg.field_2._8_8_)->Usage != USAGE_UNIFIED)) {
      FormatString<char[82]>
                ((string *)local_58,
                 (char (*) [82])
                 "Buffer must be created as USAGE_STAGING or USAGE_UNIFIED to be mapped for reading"
                );
      pCVar5 = (Char *)std::__cxx11::string::c_str();
      DebugAssertionFailed
                (pCVar5,"MapBuffer",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/DeviceContextVkImpl.cpp"
                 ,0x875);
      std::__cxx11::string::~string((string *)local_58);
    }
    MVar2 = Diligent::operator&(MapFlags,MAP_FLAG_DO_NOT_WAIT);
    if (MVar2 == MAP_FLAG_NONE) {
      FormatString<char[207]>
                ((string *)((long)&msg_1.field_2 + 8),
                 (char (*) [207])
                 "Vulkan backend never waits for GPU when mapping staging buffers for reading. Applications must use fences or other synchronization methods to explicitly synchronize access and use MAP_FLAG_DO_NOT_WAIT flag."
                );
      puVar1 = DebugMessageCallback;
      if (DebugMessageCallback != (undefined *)0x0) {
        uVar6 = std::__cxx11::string::c_str();
        (*(code *)puVar1)(1,uVar6,0);
      }
      std::__cxx11::string::~string((string *)(msg_1.field_2._M_local_buf + 8));
    }
    pvVar7 = BufferVkImpl::GetCPUAddress(this_00);
    *pMappedData = pvVar7;
  }
  else if (MapType == MAP_WRITE) {
    if ((((BufferDesc *)msg.field_2._8_8_)->Usage == USAGE_STAGING) ||
       (((BufferDesc *)msg.field_2._8_8_)->Usage == USAGE_UNIFIED)) {
      pvVar7 = BufferVkImpl::GetCPUAddress(this_00);
      *pMappedData = pvVar7;
    }
    else if (((BufferDesc *)msg.field_2._8_8_)->Usage == USAGE_DYNAMIC) {
      MVar2 = Diligent::operator|(MAP_FLAG_DISCARD,MAP_FLAG_NO_OVERWRITE);
      MVar2 = Diligent::operator&(MapFlags,MVar2);
      uVar6 = msg.field_2._8_8_;
      if (MVar2 == MAP_FLAG_NONE) {
        msg_2.field_2._M_local_buf[0xf] =
             (char)DeviceContextBase<Diligent::EngineVkImplTraits>::GetContextId
                             ((DeviceContextBase<Diligent::EngineVkImplTraits> *)this);
        Args_2 = (char (*) [115])((long)&msg_2.field_2 + 0xf);
        FormatString<char[23],char_const*,char[110],Diligent::IndexWrapper<unsigned_char,Diligent::_DeviceContextIndexTag>>
                  ((string *)&DynamicBufferId,(Diligent *)"Failed to map buffer \'",
                   (char (*) [23])uVar6,
                   (char **)
                   "\': Vulkan buffer must be mapped for writing with MAP_FLAG_DISCARD or MAP_FLAG_NO_OVERWRITE flag. Context Id: "
                   ,(char (*) [110])Args_2,in_R9);
        pCVar5 = (Char *)std::__cxx11::string::c_str();
        DebugAssertionFailed
                  (pCVar5,"MapBuffer",
                   "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/DeviceContextVkImpl.cpp"
                   ,0x889);
        std::__cxx11::string::~string((string *)&DynamicBufferId);
      }
      msg_2.field_2._8_4_ =
           BufferBase<Diligent::EngineVkImplTraits>::GetDynamicBufferId
                     (&this_00->super_BufferBase<Diligent::EngineVkImplTraits>);
      if (msg_2.field_2._8_4_ == 0xffffffff) {
        FormatString<char[17],char_const*,char[34]>
                  ((string *)&DynAllocation,(Diligent *)"Dynamic buffer \'",
                   (char (*) [17])msg.field_2._8_8_,(char **)"\' does not have dynamic buffer ID",
                   (char (*) [34])Args_2);
        pCVar5 = (Char *)std::__cxx11::string::c_str();
        DebugAssertionFailed
                  (pCVar5,"MapBuffer",
                   "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/DeviceContextVkImpl.cpp"
                   ,0x88c);
        std::__cxx11::string::~string((string *)&DynAllocation);
      }
      sVar8 = std::
              vector<Diligent::DeviceContextVkImpl::MappedBuffer,_std::allocator<Diligent::DeviceContextVkImpl::MappedBuffer>_>
              ::size(&this->m_MappedBuffers);
      if (sVar8 <= (uint)msg_2.field_2._8_4_) {
        std::
        vector<Diligent::DeviceContextVkImpl::MappedBuffer,_std::allocator<Diligent::DeviceContextVkImpl::MappedBuffer>_>
        ::resize(&this->m_MappedBuffers,(ulong)(msg_2.field_2._8_4_ + 1));
      }
      this_01 = std::
                vector<Diligent::DeviceContextVkImpl::MappedBuffer,_std::allocator<Diligent::DeviceContextVkImpl::MappedBuffer>_>
                ::operator[](&this->m_MappedBuffers,(ulong)(uint)msg_2.field_2._8_4_);
      IVar4 = DeviceObjectBase<Diligent::IBufferVk,_Diligent::RenderDeviceVkImpl,_Diligent::BufferDesc>
              ::GetUniqueID((DeviceObjectBase<Diligent::IBufferVk,_Diligent::RenderDeviceVkImpl,_Diligent::BufferDesc>
                             *)this_00);
      pvVar9 = std::
               vector<Diligent::DeviceContextVkImpl::MappedBuffer,_std::allocator<Diligent::DeviceContextVkImpl::MappedBuffer>_>
               ::operator[](&this->m_MappedBuffers,(ulong)(uint)msg_2.field_2._8_4_);
      pvVar9->DvpBufferUID = IVar4;
      MVar2 = Diligent::operator&(MapFlags,MAP_FLAG_DISCARD);
      if ((MVar2 == MAP_FLAG_NONE) &&
         (bVar3 = VulkanDynamicAllocation::operator_cast_to_bool(&this_01->Allocation), bVar3)) {
        MVar2 = Diligent::operator&(MapFlags,MAP_FLAG_NO_OVERWRITE);
        if (MVar2 == MAP_FLAG_NONE) {
          FormatString<char[9],char_const*,char[115]>
                    ((string *)&CPUAddress,(Diligent *)0xc0c559,(char (*) [9])msg.field_2._8_8_,
                     (char **)
                     "\' is already mapped. Vulkan buffer must be mapped for writing with MAP_FLAG_DISCARD or MAP_FLAG_NO_OVERWRITE flag."
                     ,Args_2);
          pCVar5 = (Char *)std::__cxx11::string::c_str();
          DebugAssertionFailed
                    (pCVar5,"MapBuffer",
                     "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/DeviceContextVkImpl.cpp"
                     ,0x899);
          std::__cxx11::string::~string((string *)&CPUAddress);
        }
        pVVar10 = VulkanUtilities::VulkanObjectWrapper::operator_cast_to_VkBuffer_T_
                            ((VulkanObjectWrapper *)&this_00->m_VulkanBuffer);
        if (pVVar10 != (VkBuffer_T *)0x0) {
          LogError<false,char[398]>
                    (false,"MapBuffer",
                     "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/DeviceContextVkImpl.cpp"
                     ,0x8a0,(char (*) [398])
                            "Formatted or structured buffers require actual Vulkan backing resource and cannot be suballocated from dynamic heap. In current implementation, the entire contents of the backing buffer is updated when the buffer is unmapped. As a consequence, the buffer cannot be mapped with MAP_FLAG_NO_OVERWRITE flag because updating the whole buffer will overwrite regions that may still be in use by the GPU."
                    );
          return;
        }
      }
      else {
        AllocateDynamicSpace
                  ((VulkanDynamicAllocation *)((long)&msg_3.field_2 + 8),this,
                   *(Uint64 *)(msg.field_2._8_8_ + 8),this_00->m_DynamicOffsetAlignment);
        VulkanDynamicAllocation::operator=
                  (&this_01->Allocation,(VulkanDynamicAllocation *)((long)&msg_3.field_2 + 8));
      }
      bVar3 = VulkanDynamicAllocation::operator_cast_to_bool(&this_01->Allocation);
      if (bVar3) {
        pUVar11 = VulkanDynamicMemoryManager::GetCPUAddress((this_01->Allocation).pDynamicMemMgr);
        *pMappedData = pUVar11 + (this_01->Allocation).AlignedOffset;
      }
      else {
        *pMappedData = (PVoid)0x0;
      }
    }
    else {
      LogError<false,char[93]>
                (false,"MapBuffer",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/DeviceContextVkImpl.cpp"
                 ,0x8b3,(char (*) [93])
                        "Only USAGE_DYNAMIC, USAGE_STAGING and USAGE_UNIFIED Vulkan buffers can be mapped for writing"
                );
    }
  }
  else if (MapType == MAP_READ_WRITE) {
    LogError<false,char[50]>
              (false,"MapBuffer",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/DeviceContextVkImpl.cpp"
               ,0x8b8,(char (*) [50])"MAP_READ_WRITE is not supported in Vulkan backend");
  }
  else {
    FormatString<char[17]>((string *)local_140,(char (*) [17])"Unknown map type");
    pCVar5 = (Char *)std::__cxx11::string::c_str();
    DebugAssertionFailed
              (pCVar5,"MapBuffer",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/DeviceContextVkImpl.cpp"
               ,0x8bc);
    std::__cxx11::string::~string((string *)local_140);
  }
  return;
}

Assistant:

void DeviceContextVkImpl::MapBuffer(IBuffer* pBuffer, MAP_TYPE MapType, MAP_FLAGS MapFlags, PVoid& pMappedData)
{
    TDeviceContextBase::MapBuffer(pBuffer, MapType, MapFlags, pMappedData);
    BufferVkImpl* const pBufferVk = ClassPtrCast<BufferVkImpl>(pBuffer);
    const BufferDesc&   BuffDesc  = pBufferVk->GetDesc();

    if (MapType == MAP_READ)
    {
        DEV_CHECK_ERR(BuffDesc.Usage == USAGE_STAGING || BuffDesc.Usage == USAGE_UNIFIED,
                      "Buffer must be created as USAGE_STAGING or USAGE_UNIFIED to be mapped for reading");

        if ((MapFlags & MAP_FLAG_DO_NOT_WAIT) == 0)
        {
            LOG_WARNING_MESSAGE("Vulkan backend never waits for GPU when mapping staging buffers for reading. "
                                "Applications must use fences or other synchronization methods to explicitly synchronize "
                                "access and use MAP_FLAG_DO_NOT_WAIT flag.");
        }

        pMappedData = pBufferVk->GetCPUAddress();
    }
    else if (MapType == MAP_WRITE)
    {
        if (BuffDesc.Usage == USAGE_STAGING || BuffDesc.Usage == USAGE_UNIFIED)
        {
            pMappedData = pBufferVk->GetCPUAddress();
        }
        else if (BuffDesc.Usage == USAGE_DYNAMIC)
        {
            DEV_CHECK_ERR((MapFlags & (MAP_FLAG_DISCARD | MAP_FLAG_NO_OVERWRITE)) != 0, "Failed to map buffer '",
                          BuffDesc.Name, "': Vulkan buffer must be mapped for writing with MAP_FLAG_DISCARD or MAP_FLAG_NO_OVERWRITE flag. Context Id: ", GetContextId());

            const Uint32 DynamicBufferId = pBufferVk->GetDynamicBufferId();
            VERIFY(DynamicBufferId != ~0u, "Dynamic buffer '", BuffDesc.Name, "' does not have dynamic buffer ID");
            if (m_MappedBuffers.size() <= DynamicBufferId)
                m_MappedBuffers.resize(DynamicBufferId + 1);
            VulkanDynamicAllocation& DynAllocation = m_MappedBuffers[DynamicBufferId].Allocation;
#ifdef DILIGENT_DEVELOPMENT
            m_MappedBuffers[DynamicBufferId].DvpBufferUID = pBufferVk->GetUniqueID();
#endif
            if ((MapFlags & MAP_FLAG_DISCARD) != 0 || !DynAllocation)
            {
                DynAllocation = AllocateDynamicSpace(BuffDesc.Size, pBufferVk->m_DynamicOffsetAlignment);
            }
            else
            {
                DEV_CHECK_ERR(MapFlags & MAP_FLAG_NO_OVERWRITE, "Buffer '", BuffDesc.Name, "' is already mapped. Vulkan buffer must be mapped for writing with MAP_FLAG_DISCARD or MAP_FLAG_NO_OVERWRITE flag.");

                if (pBufferVk->m_VulkanBuffer != VK_NULL_HANDLE)
                {
                    LOG_ERROR("Formatted or structured buffers require actual Vulkan backing resource and cannot be suballocated "
                              "from dynamic heap. In current implementation, the entire contents of the backing buffer is updated when the buffer is unmapped. "
                              "As a consequence, the buffer cannot be mapped with MAP_FLAG_NO_OVERWRITE flag because updating the whole "
                              "buffer will overwrite regions that may still be in use by the GPU.");
                    return;
                }

                // Reuse the same allocation
            }

            if (DynAllocation)
            {
                Uint8* CPUAddress = DynAllocation.pDynamicMemMgr->GetCPUAddress();
                pMappedData       = CPUAddress + DynAllocation.AlignedOffset;
            }
            else
            {
                pMappedData = nullptr;
            }
        }
        else
        {
            LOG_ERROR("Only USAGE_DYNAMIC, USAGE_STAGING and USAGE_UNIFIED Vulkan buffers can be mapped for writing");
        }
    }
    else if (MapType == MAP_READ_WRITE)
    {
        LOG_ERROR("MAP_READ_WRITE is not supported in Vulkan backend");
    }
    else
    {
        UNEXPECTED("Unknown map type");
    }
}